

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,char_const*,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int integral_size,char16_t decimal_point,
          digit_grouping<char16_t> *grouping)

{
  char16_t *pcVar1;
  type tVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  basic_string_view<char16_t> digits;
  basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_> buffer;
  basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_> local_430;
  
  if ((grouping->sep_).thousands_sep != L'\0') {
    local_430.super_buffer<char16_t>.ptr_ = local_430.store_;
    local_430.super_buffer<char16_t>.size_ = 0;
    local_430.super_buffer<char16_t>._vptr_buffer = (_func_int **)&PTR_grow_001e68a0;
    local_430.super_buffer<char16_t>.capacity_ = 500;
    write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
              (&local_430.super_buffer<char16_t>,significand,significand_size,integral_size,
               decimal_point);
    pcVar1 = local_430.super_buffer<char16_t>.ptr_;
    tVar2 = to_unsigned<int>(integral_size);
    digits.size_._0_4_ = tVar2;
    digits.data_ = pcVar1;
    digits.size_._4_4_ = 0;
    digit_grouping<char16_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
              (grouping,out,digits);
    bVar3 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (local_430.super_buffer<char16_t>.ptr_ + integral_size,
                       local_430.super_buffer<char16_t>.ptr_ +
                       local_430.super_buffer<char16_t>.size_,out);
    basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_>::~basic_memory_buffer
              (&local_430);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
  }
  bVar3 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}